

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O0

armci_hdl_t * get_armci_nbhandle(Integer *nbhandle)

{
  int iVar1;
  uint uVar2;
  uint *in_RDI;
  int iga_hdl;
  ga_armcihdl_t *next;
  int index;
  gai_nbhdl_t *inbhandle;
  int iloc;
  int idx;
  int top;
  int i;
  int local_18;
  int local_c;
  
  uVar2 = *in_RDI & 0xff;
  lastARMCIhandle = (lastARMCIhandle + 1) % nb_max_outstanding;
  local_c = lastARMCIhandle;
  while ((local_18 = lastARMCIhandle, local_c < lastARMCIhandle + nb_max_outstanding &&
         (local_18 = local_c % nb_max_outstanding, armci_ihdl_array[local_18].active != 0))) {
    local_c = local_c + 1;
  }
  if (armci_ihdl_array[local_18].active == 1) {
    iVar1 = armci_ihdl_array[local_18].ga_hdlarr_index;
    ARMCI_Wait((armci_hdl_t *)0x250bce);
    if (armci_ihdl_array[local_18].previous == (struct_armcihdl_t *)0x0) {
      ga_ihdl_array[iVar1].ahandle = armci_ihdl_array[local_18].next;
      if (armci_ihdl_array[local_18].next != (struct_armcihdl_t *)0x0) {
        (armci_ihdl_array[local_18].next)->previous = (struct_armcihdl_t *)0x0;
      }
    }
    else {
      (armci_ihdl_array[local_18].previous)->next = armci_ihdl_array[local_18].next;
      if (armci_ihdl_array[local_18].next != (struct_armcihdl_t *)0x0) {
        (armci_ihdl_array[local_18].next)->previous = armci_ihdl_array[local_18].previous;
      }
    }
    ga_ihdl_array[iVar1].count = ga_ihdl_array[iVar1].count + -1;
  }
  armci_ihdl_array[local_18].active = 1;
  armci_ihdl_array[local_18].previous = (struct_armcihdl_t *)0x0;
  if (ga_ihdl_array[(int)uVar2].ahandle != (ga_armcihdl_t *)0x0) {
    (ga_ihdl_array[(int)uVar2].ahandle)->previous = armci_ihdl_array + local_18;
  }
  armci_ihdl_array[local_18].next = ga_ihdl_array[(int)uVar2].ahandle;
  ga_ihdl_array[(int)uVar2].ahandle = armci_ihdl_array + local_18;
  armci_ihdl_array[local_18].ga_hdlarr_index = uVar2;
  ga_ihdl_array[(int)uVar2].count = ga_ihdl_array[(int)uVar2].count + 1;
  lastARMCIhandle = local_18;
  return &armci_ihdl_array[local_18].handle;
}

Assistant:

armci_hdl_t* get_armci_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;

  lastARMCIhandle++;
  lastARMCIhandle = lastARMCIhandle%nb_max_outstanding;
  top = lastARMCIhandle+nb_max_outstanding;
  /* default index if no handles are available */
  iloc = lastARMCIhandle;
  for (i=lastARMCIhandle; i<top; i++) {
    idx = i%nb_max_outstanding;
    if (armci_ihdl_array[idx].active == 0) {
      iloc = idx;
      break;
    }
  }
  /* if selected handle represents an outstanding request, complete it */
  if (armci_ihdl_array[iloc].active == 1) {
    int iga_hdl = armci_ihdl_array[iloc].ga_hdlarr_index;
    ARMCI_Wait(&armci_ihdl_array[iloc].handle);
    /* clean up linked list that this handle used to be a link in */
    if (armci_ihdl_array[iloc].previous != NULL) {
      /* link is not first in linked list */
      armci_ihdl_array[iloc].previous->next = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = armci_ihdl_array[iloc].previous;
      }
    } else {
      /* link is first in linked list. Need to update header */
      ga_ihdl_array[iga_hdl].ahandle = armci_ihdl_array[iloc].next;
      if (armci_ihdl_array[iloc].next != NULL) {
        armci_ihdl_array[iloc].next->previous = NULL;
      }
    }
    ga_ihdl_array[iga_hdl].count--;
  }
  /* Initialize armci handle and add this operation to the linked list
   * corresponding to nbhandle */
  ARMCI_INIT_HANDLE(&armci_ihdl_array[iloc].handle);
  armci_ihdl_array[iloc].active = 1;
  armci_ihdl_array[iloc].previous = NULL;
  if (ga_ihdl_array[index].ahandle) {
    ga_ihdl_array[index].ahandle->previous = &armci_ihdl_array[iloc];
  }
  armci_ihdl_array[iloc].next = ga_ihdl_array[index].ahandle;
  ga_ihdl_array[index].ahandle =  &armci_ihdl_array[iloc];
  armci_ihdl_array[iloc].ga_hdlarr_index = index;
  ga_ihdl_array[index].count++;

  /* reset lastARMCIhandle to iloc */
  lastARMCIhandle = iloc;

  return &armci_ihdl_array[iloc].handle;
}